

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_value.hpp
# Opt level: O3

atomic<double> * __thiscall
ylt::metric::thread_local_value<double>::get_value(thread_local_value<double> *this,size_t index)

{
  pointer paVar1;
  __base_type _Var2;
  bool bVar3;
  
  if ((this->duplicates_).
      super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start[index]._M_b._M_p == (__pointer_type)0x0) {
    _Var2._M_p = (__pointer_type)operator_new(8);
    (_Var2._M_p)->super___atomic_float<double> = (__atomic_float<double>)0x0;
    paVar1 = (this->duplicates_).
             super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + index;
    LOCK();
    bVar3 = (paVar1->_M_b)._M_p == (__pointer_type)0x0;
    if (bVar3) {
      (paVar1->_M_b)._M_p = _Var2._M_p;
    }
    UNLOCK();
    if (!bVar3) {
      operator_delete(_Var2._M_p,8);
    }
  }
  return (this->duplicates_).
         super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start[index]._M_b._M_p;
}

Assistant:

auto &get_value(size_t index) {
    if (duplicates_[index] == nullptr) {
      auto ptr = new std::atomic<value_type>(0);

      std::atomic<value_type> *expected = nullptr;
      if (!duplicates_[index].compare_exchange_strong(expected, ptr)) {
        delete ptr;
      }
    }
    return *duplicates_[index];
  }